

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

size_t __thiscall Apt::GetEdgeBetweenNodes(Apt *this,size_t idxA,size_t idxB)

{
  size_type __n;
  bool bVar1;
  reference puVar2;
  size_t sVar3;
  size_t in_RDX;
  size_t in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  TaxiEdge *e;
  size_t idxE;
  const_iterator __end1;
  const_iterator __begin1;
  vecIdxTy *__range1;
  TaxiNode *a;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  vecIdxTy *local_30;
  reference local_28;
  size_t local_20;
  size_t local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at
                       ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffffb0,
                        (size_type)in_RDI);
  local_30 = &local_28->vecEdges;
  local_38._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return 0xfffffffffffffffe;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_38);
    __n = *puVar2;
    in_stack_ffffffffffffffb0 =
         std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::operator[]
                   ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)
                    &in_RDI[9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,__n);
    sVar3 = TaxiEdge::otherNode(in_stack_ffffffffffffffb0,local_18);
    if (sVar3 == local_20) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_38);
  }
  return __n;
}

Assistant:

size_t GetEdgeBetweenNodes (size_t idxA, size_t idxB)
    {
        const TaxiNode& a = vecTaxiNodes.at(idxA);
        for (size_t idxE: a.vecEdges) {
            const TaxiEdge& e = vecTaxiEdges[idxE];
            if (e.otherNode(idxA) == idxB)
                return idxE;
        }
        return EDGE_UNAVAIL;
    }